

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listTags(Config *config)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pcVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar7;
  undefined4 extraout_var_01;
  pointer pTVar8;
  iterator iVar9;
  _Rb_tree_node_base *p_Var10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  pointer *ppPVar13;
  pointer pbVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar15;
  string tagName;
  Text wrapper;
  string lcaseTagName;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  ostringstream oss;
  undefined1 local_2e8 [40];
  Text local_2c0;
  undefined1 local_268 [32];
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_248;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_228;
  pointer local_208;
  pointer local_200;
  undefined1 local_1f8 [8];
  _Rb_tree_node_base _Stack_1f0;
  pointer local_1d0;
  undefined1 *local_1c8;
  size_type local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  char local_198 [8];
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  local_170;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_158;
  TagAliasRegistry *local_140;
  ios_base local_138 [264];
  
  iVar5 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_248,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar5));
  iVar5 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar5) == ((long *)CONCAT44(extraout_var_00,iVar5))[1]) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All available tags:\n",0x14);
    TagAliasRegistry::get();
    local_190._8_8_ = 0;
    local_180._M_allocated_capacity._0_4_ = local_180._M_allocated_capacity._0_4_ & 0xffffff00;
    local_170.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_170.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_170.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_140 = &TagAliasRegistry::get::instance;
    paVar2 = &local_2c0.str.field_2;
    local_2c0.str._M_dataplus._M_p = (pointer)paVar2;
    local_190._0_8_ = &local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"*","");
    this = TestSpecParser::parse((TestSpecParser *)local_1a8,&local_2c0.str);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_2e8,&(this->m_testSpec).m_filters);
    _Stack_1f0._M_parent =
         (_Base_ptr)
         local_248.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    _Stack_1f0._0_8_ =
         local_248.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1f8 = (undefined1  [8])
                local_248.
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_248.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2e8._16_8_;
    local_248.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_2e8._0_8_;
    local_248.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2e8._8_8_;
    local_2e8._0_8_ = (pointer)0x0;
    local_2e8._8_8_ = (pointer)0x0;
    local_2e8._16_8_ = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_1f8);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0.str._M_dataplus._M_p != paVar2) {
      operator_delete(local_2c0.str._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_158);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector(&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tags for matching test cases:\n",0x1e);
  }
  _Stack_1f0._M_left = &_Stack_1f0;
  _Stack_1f0._0_8_ = _Stack_1f0._0_8_ & 0xffffffff00000000;
  _Stack_1f0._M_parent = (_Base_ptr)0x0;
  local_1d0 = (pointer)0x0;
  local_228.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_1f0._M_right = _Stack_1f0._M_left;
  pIVar7 = getRegistryHub();
  iVar5 = (*pIVar7->_vptr_IRegistryHub[3])(pIVar7);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar5),&local_248,config,&local_228,0);
  local_208 = local_228.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_228.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_228.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar8 = local_228.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
             .super__Vector_impl_data._M_start;
    do {
      local_200 = pTVar8;
      for (p_Var10 = (pTVar8->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var10 !=
          &(pTVar8->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        local_2e8._0_8_ = (pointer)(local_2e8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2e8,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        toLower((string *)local_268,(string *)local_2e8);
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                        *)local_1f8,(string *)local_268);
        if (iVar9._M_node == &_Stack_1f0) {
          local_2c0.str._M_string_length._0_4_ = 0;
          local_2c0.str.field_2._M_allocated_capacity = 0;
          local_2c0.str.field_2._8_8_ = &local_2c0.str._M_string_length;
          local_2c0.attr.indent = 0;
          local_2c0.attr.width = 0;
          local_1a8 = (undefined1  [8])local_198;
          local_2c0.attr.initialIndent = local_2c0.str.field_2._8_8_;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,local_268._0_8_,
                     (pointer)(local_268._0_8_ + local_268._8_8_));
          if (local_2c0.str.field_2._M_allocated_capacity == 0) {
            local_180._8_8_ = 0;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_180;
            uVar6 = 0;
            ppPVar13 = &local_170.
                        super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_170.
                 super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            local_180._8_8_ = local_2c0.str.field_2._M_allocated_capacity;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2c0.str.field_2._8_8_;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2c0.attr.initialIndent;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(local_2c0.str.field_2._M_allocated_capacity + 8) = &local_180;
            local_170.
            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2c0.attr.indent;
            local_2c0.str.field_2._M_allocated_capacity = 0;
            local_2c0.str.field_2._8_8_ = &local_2c0.str._M_string_length;
            ppPVar13 = (pointer *)&local_2c0.attr.indent;
            uVar6 = (uint)local_2c0.str._M_string_length;
            local_2c0.attr.initialIndent = local_2c0.str.field_2._8_8_;
          }
          *ppPVar13 = (pointer)0x0;
          vStack_158.
          super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_2c0.attr.width;
          local_180._M_allocated_capacity._0_4_ = uVar6;
          pVar15 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                   ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagInfo>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                               *)local_1f8,
                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                               *)local_1a8);
          iVar9._M_node = (_Base_ptr)pVar15.first._M_node;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_190 + 8));
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_2c0);
        }
        iVar9._M_node[3]._M_left = (_Base_ptr)((long)&(iVar9._M_node[3]._M_left)->_M_color + 1);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(iVar9._M_node + 2),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
        if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
          operator_delete((void *)local_268._0_8_);
        }
        if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
          operator_delete((void *)local_2e8._0_8_);
        }
      }
      pTVar8 = local_200 + 1;
    } while (pTVar8 != local_208);
  }
  if (_Stack_1f0._M_left != &_Stack_1f0) {
    p_Var12 = _Stack_1f0._M_left;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      pcVar1 = local_198 + *(long *)((long)local_1a8 + -0x18);
      pcVar1[0] = '\x02';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  ",2);
      TagInfo::all_abi_cxx11_((string *)local_2e8,(TagInfo *)(p_Var12 + 2));
      local_268._16_8_ = 0x4f;
      local_268[0x18] = '\t';
      local_268._0_8_ = (pointer)0x0;
      local_268._8_8_ = 0;
      std::__cxx11::stringbuf::str();
      local_268._8_8_ = local_1c0;
      local_268._16_8_ = 0x46;
      Tbc::Text::Text(&local_2c0,(string *)local_2e8,(TextAttributes *)local_268);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
        operator_delete((void *)local_2e8._0_8_);
      }
      std::__cxx11::stringbuf::str();
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_2e8._0_8_,local_2e8._8_8_);
      pbVar3 = local_2c0.lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = local_2c0.lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar3;
          pbVar14 = pbVar14 + 1) {
        if (pbVar14 !=
            local_2c0.lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
        operator_delete((void *)local_2e8._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c0.lines);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0.str._M_dataplus._M_p != &local_2c0.str.field_2) {
        operator_delete(local_2c0.str._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != &_Stack_1f0);
  }
  pcVar4 = local_1d0;
  paVar2 = &local_2c0.str.field_2;
  local_2c0.str._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"tag","");
  local_1a8 = (undefined1  [8])pcVar4;
  local_1a0._M_p = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_2c0.str._M_dataplus._M_p,
             local_2c0.str._M_dataplus._M_p +
             CONCAT44(local_2c0.str._M_string_length._4_4_,(uint)local_2c0.str._M_string_length));
  operator<<((ostream *)&std::cout,(pluralise *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  if (local_1a0._M_p != local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.str._M_dataplus._M_p != paVar2) {
    operator_delete(local_2c0.str._M_dataplus._M_p);
  }
  pcVar4 = local_1d0;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_228);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
               *)local_1f8);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_248);
  return (size_t)pcVar4;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }